

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O2

int testJSONHelpers(int param_1,char **param_2)

{
  _Manager_type p_Var1;
  char *pcVar2;
  _Invoker_type p_Var3;
  pointer pMVar4;
  bool bVar5;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[6]> _Var6;
  ErrorCode EVar7;
  ostream *poVar8;
  Object<(anonymous_namespace)::ObjectStruct> *this;
  Value *pVVar9;
  pointer pMVar10;
  unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  uVar11;
  Value *__args_1;
  Value *__args_1_00;
  Value *__args_1_01;
  Value *__args_1_02;
  Value *__args_1_03;
  Value *__args_1_04;
  Value *__args_1_05;
  Value *__args_1_06;
  Value *__args_1_07;
  int iVar12;
  ObjectStruct *name;
  int iVar13;
  InheritedStruct *this_00;
  undefined1 required;
  undefined8 in_R8;
  pointer pMVar14;
  long lVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  int i;
  undefined4 uStack_3d4;
  undefined1 uStack_3d0;
  undefined7 uStack_3cf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3c8;
  ErrorCode EStack_3b8;
  bool local_3b4;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  Object<(anonymous_namespace)::ObjectStruct> helper;
  Value v;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  InheritedStruct s4_1;
  ObjectStruct s1;
  ObjectStruct s5;
  ObjectStruct s4;
  ObjectStruct s2;
  ObjectStruct s7;
  ObjectStruct s3;
  _Any_data local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  ObjectStruct s6;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  local_90;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  local_70;
  function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> local_50;
  
  Json::Value::Value(&v,2);
  _i = (ulong)(uint)uStack_3d4 << 0x20;
  EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::operator()
                    ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     (anonymous_namespace)::IntHelper,&i,&v);
  iVar13 = 1;
  if (EVar7 == Success) {
    if (i != 2) {
      poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
      iVar12 = 0x4f;
      goto LAB_0016686e;
    }
    _i = _i & 0xffffffff00000000;
    Json::Value::Value((Value *)&helper,nullValue);
    Json::Value::operator=(&v,(Value *)&helper);
    Json::Value::~Value((Value *)&helper);
    EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::operator()
                      ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                       (anonymous_namespace)::IntHelper,&i,&v);
    if (EVar7 != InvalidInt) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(IntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                              );
      iVar12 = 0x53;
      goto LAB_0016686e;
    }
    _i = _i & 0xffffffff00000000;
    EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::operator()
                      ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                       (anonymous_namespace)::IntHelper,&i,(Value *)0x0);
    if (EVar7 != Success) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(IntHelper(i, nullptr) == ErrorCode::Success) failed on line "
                              );
      iVar12 = 0x56;
      goto LAB_0016686e;
    }
    if (i != 1) {
      poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ");
      iVar12 = 0x57;
      goto LAB_0016686e;
    }
    Json::Value::~Value(&v);
    Json::Value::Value(&v,2);
    _i = _i & 0xffffffff00000000;
    EVar7 = std::function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>::
            operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                        *)&i,(uint *)&v,__args_1);
    if (EVar7 == Success) {
      if (i != 2) {
        poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
        iVar12 = 0x61;
        goto LAB_001669ad;
      }
      _i = _i & 0xffffffff00000000;
      Json::Value::Value((Value *)&helper,nullValue);
      Json::Value::operator=(&v,(Value *)&helper);
      Json::Value::~Value((Value *)&helper);
      EVar7 = std::function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
              ::operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                            *)&i,(uint *)&v,__args_1_00);
      if (EVar7 != InvalidInt) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                                );
        iVar12 = 0x65;
        goto LAB_001669ad;
      }
      _i = _i & 0xffffffff00000000;
      EVar7 = std::function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
              ::operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                            *)&i,(uint *)0x0,__args_1_01);
      if (EVar7 != Success) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(UIntHelper(i, nullptr) == ErrorCode::Success) failed on line "
                                );
        iVar12 = 0x68;
        goto LAB_001669ad;
      }
      if (i != 1) {
        poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ");
        iVar12 = 0x69;
        goto LAB_001669ad;
      }
      Json::Value::~Value(&v);
      iVar13 = 1;
      Json::Value::Value(&v,true);
      _i = _i & 0xffffffffffffff00;
      EVar7 = std::function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>::
              operator()((function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)> *
                         )&i,(bool *)&v,__args_1_02);
      if (EVar7 == Success) {
        if ((char)i == '\0') {
          poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(b) failed on line ");
          iVar12 = 0x73;
          goto LAB_00166aaa;
        }
        _i = _i & 0xffffffffffffff00;
        Json::Value::Value((Value *)&helper,false);
        Json::Value::operator=(&v,(Value *)&helper);
        Json::Value::~Value((Value *)&helper);
        EVar7 = std::function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>::
                operator()((function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>
                            *)&i,(bool *)&v,__args_1_03);
        if (EVar7 != Success) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::Success) failed on line "
                                  );
          iVar12 = 0x77;
          goto LAB_00166aaa;
        }
        if ((char)i == '\x01') {
          poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ");
          iVar12 = 0x78;
          goto LAB_00166aaa;
        }
        _i = _i & 0xffffffffffffff00;
        Json::Value::Value((Value *)&helper,4);
        Json::Value::operator=(&v,(Value *)&helper);
        Json::Value::~Value((Value *)&helper);
        EVar7 = std::function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>::
                operator()((function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>
                            *)&i,(bool *)&v,__args_1_04);
        if (EVar7 != InvalidBool) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::InvalidBool) failed on line "
                                  );
          iVar12 = 0x7c;
          goto LAB_00166aaa;
        }
        i._0_1_ = 1;
        EVar7 = std::function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>::
                operator()((function<(anonymous_namespace)::ErrorCode_(bool_&,_const_Json::Value_*)>
                            *)&i,(bool *)0x0,__args_1_05);
        if (EVar7 != Success) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(BoolHelper(b, nullptr) == ErrorCode::Success) failed on line "
                                  );
          iVar12 = 0x7f;
          goto LAB_00166aaa;
        }
        if ((char)i == '\x01') {
          poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ");
          iVar12 = 0x80;
          goto LAB_00166aaa;
        }
        Json::Value::~Value(&v);
        Json::Value::Value(&v,"str");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"",(allocator<char> *)&helper);
        EVar7 = std::
                function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                             ,&v);
        if (EVar7 == Success) {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"str");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(str == \"str\") failed on line ");
            iVar12 = 0x8a;
            goto LAB_00166cd2;
          }
          std::__cxx11::string::assign((char *)&i);
          Json::Value::Value((Value *)&helper,nullValue);
          Json::Value::operator=(&v,(Value *)&helper);
          Json::Value::~Value((Value *)&helper);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i,&v);
          if (EVar7 != InvalidString) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringHelper(str, &v) == ErrorCode::InvalidString) failed on line "
                                    );
            iVar12 = 0x8e;
            goto LAB_00166cd2;
          }
          std::__cxx11::string::assign((char *)&i);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringHelper_abi_cxx11_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i,(Value *)0x0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringHelper(str, nullptr) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x91;
            goto LAB_00166cd2;
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"default");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(str == \"default\") failed on line ");
            iVar12 = 0x92;
            goto LAB_00166cd2;
          }
          std::__cxx11::string::~string((string *)&i);
          Json::Value::~Value(&v);
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          helper._24_4_ = helper._24_4_ & 0xffffff00;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          helper.Success = Success;
          helper.Fail = InvalidSubObject;
          helper.AllowExtra = true;
          _i = 8;
          uStack_3d0 = -0x2e;
          uStack_3cf = 0x630b;
          std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
                    (&local_50,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     (anonymous_namespace)::IntHelper);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,int,std::function<(anonymous_namespace)::ErrorCode(int&,Json::Value_const*)>>
                    (&helper,(string_view *)&i,(offset_in_ObjectStruct_to_int)&local_50,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     &DAT_00000001,SUB81(in_R8,0));
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v,&helper);
          std::_Function_base::~_Function_base(&local_50.super__Function_base);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object(&helper);
          aStack_3c8._M_local_buf[0] = '\0';
          aStack_3c8._M_allocated_capacity._1_7_ = 0;
          aStack_3c8._8_4_ = aStack_3c8._8_4_ & 0xffffff00;
          _i = (void *)0x0;
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._12_4_ = 0;
          EStack_3b8 = InvalidObject;
          local_3b4 = true;
          s2.Field1._M_dataplus._M_p = &DAT_00000006;
          s2.Field1._M_string_length = (size_type)anon_var_dwarf_80ecf;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function(&local_70,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&i,(string_view *)&s2,
                     (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                      )&local_70,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&DAT_00000001,SUB81(in_R8,0));
          s3.Field1._M_dataplus._M_p = &DAT_00000006;
          s3.Field1._M_string_length = (size_type)anon_var_dwarf_80ee8;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&s4_1,
                     (Object<(anonymous_namespace)::ObjectStruct> *)&v);
          s1.Field1.field_2._M_allocated_capacity = 0;
          s1.Field1.field_2._8_8_ = 0;
          s1.Field1._M_dataplus._M_p = (pointer)0x0;
          s1.Field1._M_string_length = 0;
          this = (Object<(anonymous_namespace)::ObjectStruct> *)operator_new(0x28);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    (this,(Object<(anonymous_namespace)::ObjectStruct> *)&s4_1);
          s1.Field1.field_2._8_8_ =
               std::
               _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>_>
               ::_M_invoke;
          s1.Field1.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>_>
               ::_M_manager;
          s1.Field1._M_dataplus._M_p = (pointer)this;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::BindPrivate
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&i,(string_view *)&s3,
                     (MemberFunction *)&s1,true);
          std::_Function_base::~_Function_base((_Function_base *)&s1);
          s1.Field1._M_dataplus._M_p = &DAT_00000006;
          s1.Field1._M_string_length = (size_type)anon_var_dwarf_80ef3;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function(&local_90,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&i,(string_view *)&s1,&local_90,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&DAT_00000001,SUB81(in_R8,0));
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    (&helper,(Object<(anonymous_namespace)::ObjectStruct> *)&i);
          std::_Function_base::~_Function_base(&local_90.super__Function_base);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&s4_1);
          std::_Function_base::~_Function_base(&local_70.super__Function_base);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&i);
          Json::Value::Value((Value *)&i,objectValue);
          Json::Value::Value((Value *)&s1,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)&i,"field1");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          Json::Value::Value((Value *)&s1,objectValue);
          pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          Json::Value::Value((Value *)&s1,2);
          pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
          pVVar9 = Json::Value::operator[](pVVar9,"subfield");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          Json::Value::Value((Value *)&s1,"world!");
          pVVar9 = Json::Value::operator[]((Value *)&i,"field3");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          Json::Value::Value((Value *)&s1,"extra");
          pVVar9 = Json::Value::operator[]((Value *)&i,"extra");
          Json::Value::operator=(pVVar9,(Value *)&s1);
          Json::Value::~Value((Value *)&s1);
          s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
          s1.Field1._M_string_length = 0;
          s1.Field1.field_2._M_allocated_capacity =
               s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::ObjectStruct>::operator()(&helper,&s1,(Value *)&i);
          if (EVar7 == Success) {
            bVar5 = std::operator==(&s1.Field1,"Hello");
            if (!bVar5) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
              iVar13 = 0xac;
              goto LAB_00167462;
            }
            if (s1.Field2 != 2) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(s1.Field2 == 2) failed on line ");
              iVar13 = 0xad;
              goto LAB_00167462;
            }
            Json::Value::Value((Value *)&s2,"wrong");
            pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
            pVVar9 = Json::Value::operator[](pVVar9,"subfield");
            Json::Value::operator=(pVVar9,(Value *)&s2);
            Json::Value::~Value((Value *)&s2);
            s2.Field1._M_dataplus._M_p = (pointer)&s2.Field1.field_2;
            s2.Field1._M_string_length = 0;
            s2.Field1.field_2._M_local_buf[0] = '\0';
            EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                    Object<(anonymous_namespace)::ObjectStruct>::operator()(&helper,&s2,(Value *)&i)
            ;
            if (EVar7 == InvalidInt) {
              pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
              Json::Value::removeMember(pVVar9,"subfield");
              s3.Field1._M_dataplus._M_p = (pointer)&s3.Field1.field_2;
              s3.Field1._M_string_length = 0;
              s3.Field1.field_2._M_local_buf[0] = '\0';
              EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                      Object<(anonymous_namespace)::ObjectStruct>::operator()
                                (&helper,&s3,(Value *)&i);
              if (EVar7 == InvalidSubObject) {
                Json::Value::removeMember((Value *)&i,"field2");
                s4.Field1._M_dataplus._M_p = (pointer)&s4.Field1.field_2;
                s4.Field1._M_string_length = 0;
                s4.Field1.field_2._M_allocated_capacity =
                     s4.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                        Object<(anonymous_namespace)::ObjectStruct>::operator()
                                  (&helper,&s4,(Value *)&i);
                if (EVar7 == InvalidObject) {
                  Json::Value::Value((Value *)&s5,objectValue);
                  pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
                  Json::Value::operator=(pVVar9,(Value *)&s5);
                  Json::Value::~Value((Value *)&s5);
                  Json::Value::Value((Value *)&s5,2);
                  pVVar9 = Json::Value::operator[]((Value *)&i,"field2");
                  pVVar9 = Json::Value::operator[](pVVar9,"subfield");
                  Json::Value::operator=(pVVar9,(Value *)&s5);
                  Json::Value::~Value((Value *)&s5);
                  Json::Value::Value((Value *)&s5,3);
                  pVVar9 = Json::Value::operator[]((Value *)&i,"field3");
                  Json::Value::operator=(pVVar9,(Value *)&s5);
                  Json::Value::~Value((Value *)&s5);
                  s5.Field1._M_dataplus._M_p = (pointer)&s5.Field1.field_2;
                  s5.Field1._M_string_length = 0;
                  s5.Field1.field_2._M_local_buf[0] = '\0';
                  EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                          Object<(anonymous_namespace)::ObjectStruct>::operator()
                                    (&helper,&s5,(Value *)&i);
                  if (EVar7 == InvalidString) {
                    Json::Value::removeMember((Value *)&i,"field3");
                    s6.Field1._M_dataplus._M_p = (pointer)&s6.Field1.field_2;
                    s6.Field1._M_string_length = 0;
                    s6.Field1.field_2._M_local_buf[0] = '\0';
                    EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                            Object<(anonymous_namespace)::ObjectStruct>::operator()
                                      (&helper,&s6,(Value *)&i);
                    if (EVar7 == InvalidObject) {
                      Json::Value::Value((Value *)&s7,"Hello");
                      Json::Value::operator=((Value *)&i,(Value *)&s7);
                      Json::Value::~Value((Value *)&s7);
                      s7.Field1._M_dataplus._M_p = (pointer)&s7.Field1.field_2;
                      s7.Field1._M_string_length = 0;
                      s7.Field1.field_2._M_local_buf[0] = '\0';
                      EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::operator()
                                        (&helper,&s7,(Value *)&i);
                      if (EVar7 == InvalidObject) {
                        local_e0._M_unused._M_object = &local_d0;
                        local_e0._8_8_ = 0;
                        local_d0._M_local_buf[0] = '\0';
                        EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                Object<(anonymous_namespace)::ObjectStruct>::operator()
                                          (&helper,(ObjectStruct *)&local_e0,(Value *)0x0);
                        bVar5 = EVar7 == InvalidObject;
                        if (!bVar5) {
                          poVar8 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(helper(s8, nullptr) == ErrorCode::InvalidObject) failed on line "
                                                  );
                          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xca);
                          std::operator<<(poVar8,"\n");
                        }
                        std::__cxx11::string::~string((string *)local_e0._M_pod_data);
                      }
                      else {
                        poVar8 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(helper(s7, &v) == ErrorCode::InvalidObject) failed on line "
                                                );
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,199);
                        std::operator<<(poVar8,"\n");
                        bVar5 = false;
                      }
                      std::__cxx11::string::~string((string *)&s7);
                    }
                    else {
                      poVar8 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(helper(s6, &v) == ErrorCode::InvalidObject) failed on line "
                                              );
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xc3);
                      std::operator<<(poVar8,"\n");
                      bVar5 = false;
                    }
                    std::__cxx11::string::~string((string *)&s6);
                  }
                  else {
                    poVar8 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(helper(s5, &v) == ErrorCode::InvalidString) failed on line "
                                            );
                    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xbf);
                    std::operator<<(poVar8,"\n");
                    bVar5 = false;
                  }
                  std::__cxx11::string::~string((string *)&s5);
                }
                else {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(helper(s4, &v) == ErrorCode::InvalidObject) failed on line "
                                          );
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb9);
                  std::operator<<(poVar8,"\n");
                  bVar5 = false;
                }
                std::__cxx11::string::~string((string *)&s4);
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(helper(s3, &v) == ErrorCode::InvalidSubObject) failed on line "
                                        );
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb5);
                std::operator<<(poVar8,"\n");
                bVar5 = false;
              }
              std::__cxx11::string::~string((string *)&s3);
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidInt) failed on line "
                                      );
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb1);
              std::operator<<(poVar8,"\n");
              bVar5 = false;
            }
            std::__cxx11::string::~string((string *)&s2);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0xab;
LAB_00167462:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            std::operator<<(poVar8,"\n");
            bVar5 = false;
          }
          std::__cxx11::string::~string((string *)&s1);
          Json::Value::~Value((Value *)&i);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object(&helper);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
          if (!bVar5) {
            return 1;
          }
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          helper._24_4_ = helper._24_4_ & 0xffffff00;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          helper.Success = Success;
          helper.Fail = InvalidObject;
          helper.AllowExtra = true;
          s4_1.super_ObjectStruct.Field1._M_dataplus._M_p = &DAT_00000006;
          s4_1.super_ObjectStruct.Field1._M_string_length = (size_type)anon_var_dwarf_80ecf;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&s6,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                             *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&v,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                            *)&s6);
          v.limit_ = 0;
          _i = (void *)0x0;
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._M_local_buf[0] = '\0';
          aStack_3c8._M_allocated_capacity._1_7_ = 0;
          aStack_3c8._8_4_ = 0;
          aStack_3c8._12_4_ = 0;
          _i = operator_new(0x28);
          *(LargestInt *)_i = 0;
          ((ValueHolder *)(_i + 8))->int_ = 0;
          ((ValueHolder *)(_i + 0x10))->int_ = 0;
          ((ValueHolder *)(_i + 0x18))->int_ = v.start_;
          uVar11._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )v.comments_;
          if (v.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
               )0x0) {
            *(ValueHolder *)_i = v.value_;
            *(undefined8 *)(_i + 8) = v._8_8_;
            *(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              *)(_i + 0x10) =
                 v.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl;
            uVar11._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )&v.comments_;
            v.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            v.start_ = 0;
          }
          ((ValueHolder *)(_i + 0x20))->int_ = 0;
          aStack_3c8._8_4_ = 0x16b3fc;
          aStack_3c8._12_4_ = 0;
          aStack_3c8._M_local_buf[0] = '\f';
          aStack_3c8._M_allocated_capacity._1_7_ = 0x16b4;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&helper,(string_view *)&s4_1,
                     (MemberFunction *)&i,
                     uVar11._M_t.
                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl._0_1_);
          std::_Function_base::~_Function_base((_Function_base *)&i);
          std::_Function_base::~_Function_base((_Function_base *)&v);
          s1.Field1._M_dataplus._M_p = &DAT_00000006;
          s1.Field1._M_string_length = (size_type)anon_var_dwarf_80ee8;
          std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
                    ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&s7,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     (anonymous_namespace)::IntHelper);
          std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
                    ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&v,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&s7)
          ;
          v.limit_ = 0x20;
          _i = (void *)0x0;
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._M_local_buf[0] = '\0';
          aStack_3c8._M_allocated_capacity._1_7_ = 0;
          aStack_3c8._8_4_ = 0;
          aStack_3c8._12_4_ = 0;
          _i = operator_new(0x28);
          *(LargestInt *)_i = 0;
          ((ValueHolder *)(_i + 8))->int_ = 0;
          ((ValueHolder *)(_i + 0x10))->int_ = 0;
          ((ValueHolder *)(_i + 0x18))->int_ = v.start_;
          uVar11._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )v.comments_;
          if (v.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
               )0x0) {
            *(ValueHolder *)_i = v.value_;
            *(undefined8 *)(_i + 8) = v._8_8_;
            *(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              *)(_i + 0x10) =
                 v.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl;
            uVar11._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )&v.comments_;
            v.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            v.start_ = 0;
          }
          ((ValueHolder *)(_i + 0x20))->int_ = 0x20;
          aStack_3c8._8_4_ = 0x16b49c;
          aStack_3c8._12_4_ = 0;
          aStack_3c8._M_local_buf[0] = -0x54;
          aStack_3c8._M_allocated_capacity._1_7_ = 0x16b4;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&helper,(string_view *)&s1,
                     (MemberFunction *)&i,
                     uVar11._M_t.
                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl._0_1_);
          std::_Function_base::~_Function_base((_Function_base *)&i);
          std::_Function_base::~_Function_base((_Function_base *)&v);
          s2.Field1._M_dataplus._M_p = &DAT_00000006;
          s2.Field1._M_string_length = (size_type)anon_var_dwarf_80ef3;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&local_e0,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&v,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                            *)&local_e0);
          v.limit_ = 0x28;
          _i = (void *)0x0;
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._M_local_buf[0] = '\0';
          aStack_3c8._M_allocated_capacity._1_7_ = 0;
          aStack_3c8._8_4_ = 0;
          aStack_3c8._12_4_ = 0;
          _i = operator_new(0x28);
          *(size_type *)_i = 0;
          *(size_type *)(_i + 8) = 0;
          *(size_type *)(_i + 0x10) = 0;
          *(ptrdiff_t *)(_i + 0x18) = v.start_;
          uVar11._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )v.comments_;
          if (v.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
               )0x0) {
            *(ValueHolder *)_i = v.value_;
            *(undefined8 *)(_i + 8) = v._8_8_;
            *(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              *)(_i + 0x10) =
                 v.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl;
            uVar11._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )&v.comments_;
            v.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            v.start_ = 0;
          }
          *(size_type *)(_i + 0x20) = 0x28;
          aStack_3c8._8_4_ = 0x16b53c;
          aStack_3c8._12_4_ = 0;
          aStack_3c8._M_local_buf[0] = 'L';
          aStack_3c8._M_allocated_capacity._1_7_ = 0x16b5;
          name = &s2;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&helper,(string_view *)name,
                     (MemberFunction *)&i,
                     uVar11._M_t.
                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl._0_1_);
          std::_Function_base::~_Function_base((_Function_base *)&i);
          std::_Function_base::~_Function_base((_Function_base *)&v);
          lVar15 = CONCAT71(helper.Members.
                            super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                            helper.Members.
                            super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
                   (long)helper.Members.
                         super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pMVar10 = std::
                    _Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                    ::_M_allocate((_Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                                   *)(lVar15 / 0x38),(size_t)name);
          s4.Field1.field_2._M_allocated_capacity = lVar15 + (long)pMVar10;
          pMVar4 = (pointer)CONCAT71(helper.Members.
                                     super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                     helper.Members.
                                     super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          s4.Field1._M_dataplus._M_p = (pointer)pMVar10;
          s4.Field1._M_string_length = (size_type)pMVar10;
          for (pMVar14 = helper.Members.
                         super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start; required = (undefined1)in_R8,
              pMVar14 != pMVar4; pMVar14 = pMVar14 + 1) {
            pcVar2 = (pMVar14->Name)._M_str;
            (pMVar10->Name)._M_len = (pMVar14->Name)._M_len;
            (pMVar10->Name)._M_str = pcVar2;
            *(undefined8 *)&(pMVar10->Function).super__Function_base._M_functor = 0;
            *(undefined8 *)((long)&(pMVar10->Function).super__Function_base._M_functor + 8) = 0;
            (pMVar10->Function).super__Function_base._M_manager = (_Manager_type)0x0;
            (pMVar10->Function)._M_invoker = (_Invoker_type)0x0;
            p_Var1 = (pMVar14->Function).super__Function_base._M_manager;
            if (p_Var1 != (_Manager_type)0x0) {
              (*p_Var1)((_Any_data *)&pMVar10->Function,(_Any_data *)&pMVar14->Function,
                        __clone_functor);
              p_Var3 = (_Invoker_type)(pMVar14->Function)._M_invoker;
              (pMVar10->Function).super__Function_base._M_manager =
                   (pMVar14->Function).super__Function_base._M_manager;
              (pMVar10->Function)._M_invoker = p_Var3;
            }
            pMVar10->Required = pMVar14->Required;
            pMVar10 = pMVar10 + 1;
          }
          s4.Field1.field_2._8_5_ = (undefined5)CONCAT44(helper.Success,helper._24_4_);
          s4.Field1.field_2._13_3_ = helper.Success._1_3_;
          s4._32_5_ = SUB85(CONCAT17(helper.AllowExtra,CONCAT43(helper.Fail,helper.Success._1_3_))
                            >> 0x18,0);
          s4.Field1._M_string_length = (size_type)pMVar10;
          std::_Function_base::~_Function_base((_Function_base *)&local_e0);
          std::_Function_base::~_Function_base((_Function_base *)&s7);
          std::_Function_base::~_Function_base((_Function_base *)&s6);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::InheritedStruct>::~Object
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&helper);
          Json::Value::Value((Value *)&s5,objectValue);
          Json::Value::Value(&v,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field1");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,2);
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"world!");
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field3");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"extra");
          pVVar9 = Json::Value::operator[]((Value *)&s5,"extra");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          v.value_.string_ = (char *)&v.comments_;
          v.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
          v._12_4_ = 0;
          v.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )((ulong)v.comments_.ptr_._M_t.
                         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         .
                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                         ._M_head_impl & 0xffffffffffffff00);
          local_318._0_8_ = local_308;
          local_318._8_8_ = 0;
          local_308[0] = '\0';
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::InheritedStruct>::operator()
                            ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                             (InheritedStruct *)&v,(Value *)&s5);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0xdf;
LAB_00167e1a:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            std::operator<<(poVar8,"\n");
            anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct((InheritedStruct *)&v);
            Json::Value::~Value((Value *)&s5);
            cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
            Object<(anonymous_namespace)::InheritedStruct>::~Object
                      ((Object<(anonymous_namespace)::InheritedStruct> *)&s4);
            return 1;
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&v,"Hello");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
            iVar13 = 0xe0;
            goto LAB_00167e1a;
          }
          if ((int)v.limit_ != 2) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field2 == 2) failed on line ");
            iVar13 = 0xe1;
            goto LAB_00167e1a;
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_318,"world!");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field3 == \"world!\") failed on line ");
            iVar13 = 0xe2;
            goto LAB_00167e1a;
          }
          Json::Value::Value((Value *)&helper,"wrong");
          pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
          Json::Value::operator=(pVVar9,(Value *)&helper);
          Json::Value::~Value((Value *)&helper);
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&helper.Members.
                         super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::InheritedStruct>::operator()
                            ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                             (InheritedStruct *)&helper,(Value *)&s5);
          if (EVar7 == InvalidInt) {
            Json::Value::removeMember((Value *)&s5,"field2");
            _i = &aStack_3c8;
            uStack_3d0 = '\0';
            uStack_3cf = 0;
            aStack_3c8._M_local_buf[0] = '\0';
            local_3b0._M_p = (pointer)&local_3a0;
            local_3a8 = 0;
            local_3a0._M_local_buf[0] = '\0';
            EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                    Object<(anonymous_namespace)::InheritedStruct>::operator()
                              ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                               (InheritedStruct *)&i,(Value *)&s5);
            if (EVar7 == InvalidObject) {
              Json::Value::Value((Value *)&s4_1,2);
              pVVar9 = Json::Value::operator[]((Value *)&s5,"field2");
              Json::Value::operator=(pVVar9,(Value *)&s4_1);
              Json::Value::~Value((Value *)&s4_1);
              Json::Value::Value((Value *)&s4_1,3);
              pVVar9 = Json::Value::operator[]((Value *)&s5,"field3");
              Json::Value::operator=(pVVar9,(Value *)&s4_1);
              Json::Value::~Value((Value *)&s4_1);
              s4_1.super_ObjectStruct.Field1._M_dataplus._M_p =
                   (pointer)&s4_1.super_ObjectStruct.Field1.field_2;
              s4_1.super_ObjectStruct.Field1._M_string_length = 0;
              s4_1.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
              s4_1.Field3._M_dataplus._M_p = (pointer)&s4_1.Field3.field_2;
              s4_1.Field3._M_string_length = 0;
              s4_1.Field3.field_2._M_local_buf[0] = '\0';
              EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                      Object<(anonymous_namespace)::InheritedStruct>::operator()
                                ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,&s4_1,
                                 (Value *)&s5);
              if (EVar7 == InvalidString) {
                Json::Value::removeMember((Value *)&s5,"field3");
                s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
                s1.Field1._M_string_length = 0;
                s1.Field1.field_2._M_allocated_capacity =
                     s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                        Object<(anonymous_namespace)::InheritedStruct>::operator()
                                  ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                                   (InheritedStruct *)&s1,(Value *)&s5);
                if (EVar7 == InvalidObject) {
                  Json::Value::Value((Value *)&s2,"Hello");
                  Json::Value::operator=((Value *)&s5,(Value *)&s2);
                  Json::Value::~Value((Value *)&s2);
                  s2.Field1._M_dataplus._M_p = (pointer)&s2.Field1.field_2;
                  s2.Field1._M_string_length = 0;
                  s2.Field1.field_2._M_local_buf[0] = '\0';
                  EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                          Object<(anonymous_namespace)::InheritedStruct>::operator()
                                    ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                                     (InheritedStruct *)&s2,(Value *)&s5);
                  if (EVar7 == InvalidObject) {
                    s3.Field1._M_dataplus._M_p = (pointer)&s3.Field1.field_2;
                    s3.Field1._M_string_length = 0;
                    s3.Field1.field_2._M_local_buf[0] = '\0';
                    EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                            Object<(anonymous_namespace)::InheritedStruct>::operator()
                                      ((Object<(anonymous_namespace)::InheritedStruct> *)&s4,
                                       (InheritedStruct *)&s3,(Value *)0x0);
                    bVar5 = EVar7 == InvalidObject;
                    if (!bVar5) {
                      poVar8 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(helper(s7, nullptr) == ErrorCode::InvalidObject) failed on line "
                                              );
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfa);
                      std::operator<<(poVar8,"\n");
                    }
                    anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct
                              ((InheritedStruct *)&s3);
                  }
                  else {
                    poVar8 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(helper(s6, &v) == ErrorCode::InvalidObject) failed on line "
                                            );
                    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf7);
                    std::operator<<(poVar8,"\n");
                    bVar5 = false;
                  }
                  anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct
                            ((InheritedStruct *)&s2);
                }
                else {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(helper(s5, &v) == ErrorCode::InvalidObject) failed on line "
                                          );
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf3);
                  std::operator<<(poVar8,"\n");
                  bVar5 = false;
                }
                anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct((InheritedStruct *)&s1);
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(helper(s4, &v) == ErrorCode::InvalidString) failed on line "
                                        );
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xef);
                std::operator<<(poVar8,"\n");
                bVar5 = false;
              }
              anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct(&s4_1);
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(helper(s3, &v) == ErrorCode::InvalidObject) failed on line "
                                      );
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
              std::operator<<(poVar8,"\n");
              bVar5 = false;
            }
            anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct((InheritedStruct *)&i);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidInt) failed on line "
                                    );
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe6);
            std::operator<<(poVar8,"\n");
            bVar5 = false;
          }
          anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct((InheritedStruct *)&helper);
          anon_unknown.dwarf_7e872::InheritedStruct::~InheritedStruct((InheritedStruct *)&v);
          Json::Value::~Value((Value *)&s5);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::InheritedStruct>::~Object
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&s4);
          if (!bVar5) {
            return 1;
          }
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          helper._24_4_ = helper._24_4_ & 0xffffff00;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          helper.Success = Success;
          helper.Fail = InvalidObject;
          helper.AllowExtra = false;
          _i = &DAT_00000006;
          uStack_3d0 = -0x25;
          uStack_3cf = 0x630b;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&s1,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                             *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                    (&helper,(string_view *)&i,
                     (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                      )&s1,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                            *)&DAT_00000001,(bool)required);
          s4_1.super_ObjectStruct.Field1._M_dataplus._M_p = &DAT_00000006;
          s4_1.super_ObjectStruct.Field1._M_string_length = (size_type)anon_var_dwarf_80ee8;
          std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
                    ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&s2,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     (anonymous_namespace)::IntHelper);
          iVar13 = 1;
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,int,std::function<(anonymous_namespace)::ErrorCode(int&,Json::Value_const*)>>
                    (&helper,(string_view *)&s4_1,(offset_in_ObjectStruct_to_int)&s2,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     &DAT_00000001,(bool)required);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v,&helper);
          std::_Function_base::~_Function_base((_Function_base *)&s2);
          std::_Function_base::~_Function_base((_Function_base *)&s1);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object(&helper);
          Json::Value::Value((Value *)&helper,objectValue);
          Json::Value::Value((Value *)&i,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)&helper,"field1");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          Json::Value::Value((Value *)&i,2);
          pVVar9 = Json::Value::operator[]((Value *)&helper,"field2");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._M_local_buf[0] = '\0';
          _i = &aStack_3c8;
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&i,
                             (Value *)&helper);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0x10b;
LAB_001685db:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            std::operator<<(poVar8,"\n");
LAB_001685f2:
            std::__cxx11::string::~string((string *)&i);
            Json::Value::~Value((Value *)&helper);
            cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
            Object<(anonymous_namespace)::ObjectStruct>::~Object
                      ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
            return 1;
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"Hello");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
            iVar13 = 0x10c;
            goto LAB_001685db;
          }
          if (EStack_3b8 != InvalidBool) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field2 == 2) failed on line ");
            iVar13 = 0x10d;
            goto LAB_001685db;
          }
          Json::Value::Value((Value *)&s4_1,"world!");
          pVVar9 = Json::Value::operator[]((Value *)&helper,"extra");
          Json::Value::operator=(pVVar9,(Value *)&s4_1);
          Json::Value::~Value((Value *)&s4_1);
          s4_1.super_ObjectStruct.Field1._M_dataplus._M_p =
               (pointer)&s4_1.super_ObjectStruct.Field1.field_2;
          s4_1.super_ObjectStruct.Field1._M_string_length = 0;
          s4_1.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)&v,
                             &s4_1.super_ObjectStruct,(Value *)&helper);
          if (EVar7 != InvalidObject) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidObject) failed on line "
                                    );
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x111);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&s4_1);
            goto LAB_001685f2;
          }
          std::__cxx11::string::~string((string *)&s4_1);
          std::__cxx11::string::~string((string *)&i);
          Json::Value::~Value((Value *)&helper);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          helper._24_4_ = helper._24_4_ & 0xffffff00;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          helper.Members.
          super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          helper.Success = Success;
          helper.Fail = InvalidObject;
          helper.AllowExtra = true;
          _i = &DAT_00000006;
          uStack_3d0 = -0x25;
          uStack_3cf = 0x630b;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&s2,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                             *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                    (&helper,(string_view *)&i,
                     (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                      )&s2,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                            *)0x0,(bool)required);
          s4_1.super_ObjectStruct.Field1._M_dataplus._M_p = &DAT_00000006;
          s4_1.super_ObjectStruct.Field1._M_string_length = (size_type)anon_var_dwarf_80ee8;
          std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::function
                    ((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)&s3,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                     (anonymous_namespace)::IntHelper);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<(anonymous_namespace)::ObjectStruct,int,std::function<(anonymous_namespace)::ErrorCode(int&,Json::Value_const*)>>
                    (&helper,(string_view *)&s4_1,(offset_in_ObjectStruct_to_int)&s3,
                     (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)0x0,
                     (bool)required);
          s1.Field1._M_dataplus._M_p = (pointer)0x8;
          s1.Field1._M_string_length = (size_type)anon_var_dwarf_81062;
          std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)&s4,(function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                             *)(anonymous_namespace)::StringHelper_abi_cxx11_);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::
          Bind<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                    (&helper,(string_view *)&s1,&s4,
                     (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      *)0x0,(bool)required);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v,&helper);
          std::_Function_base::~_Function_base((_Function_base *)&s4);
          std::_Function_base::~_Function_base((_Function_base *)&s3);
          std::_Function_base::~_Function_base((_Function_base *)&s2);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object(&helper);
          Json::Value::Value((Value *)&helper,objectValue);
          Json::Value::Value((Value *)&i,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)&helper,"field1");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          Json::Value::Value((Value *)&i,2);
          pVVar9 = Json::Value::operator[]((Value *)&helper,"field2");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          Json::Value::Value((Value *)&i,"world!");
          pVVar9 = Json::Value::operator[]((Value *)&helper,"field3");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          Json::Value::Value((Value *)&i,"extra");
          pVVar9 = Json::Value::operator[]((Value *)&helper,"extra");
          Json::Value::operator=(pVVar9,(Value *)&i);
          Json::Value::~Value((Value *)&i);
          uStack_3d0 = '\0';
          uStack_3cf = 0;
          aStack_3c8._M_local_buf[0] = '\0';
          _i = &aStack_3c8;
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)&v,(ObjectStruct *)&i,
                             (Value *)&helper);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0x126;
LAB_0016872f:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            std::operator<<(poVar8,"\n");
            goto LAB_001685f2;
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"Hello");
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ");
            iVar13 = 0x127;
            goto LAB_0016872f;
          }
          if (EStack_3b8 != InvalidBool) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(s1.Field2 == 2) failed on line ");
            iVar13 = 0x128;
            goto LAB_0016872f;
          }
          Json::Value::Value((Value *)&s4_1,objectValue);
          Json::Value::operator=((Value *)&helper,(Value *)&s4_1);
          Json::Value::~Value((Value *)&s4_1);
          s4_1.super_ObjectStruct.Field1._M_dataplus._M_p =
               (pointer)&s4_1.super_ObjectStruct.Field1.field_2;
          s4_1.super_ObjectStruct.Field1._M_string_length = 0;
          s4_1.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
          EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                  Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)&v,
                             &s4_1.super_ObjectStruct,(Value *)&helper);
          if (EVar7 == Success) {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&s4_1,"default");
            if (!bVar5) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(s2.Field1 == \"default\") failed on line ");
              iVar12 = 0x12d;
              goto LAB_001687f5;
            }
            if (s4_1.super_ObjectStruct.Field2 != 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(s2.Field2 == 1) failed on line ");
              iVar12 = 0x12e;
              goto LAB_001687f5;
            }
            s1.Field1._M_dataplus._M_p = (pointer)&s1.Field1.field_2;
            s1.Field1._M_string_length = 0;
            s1.Field1.field_2._M_allocated_capacity =
                 s1.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            EVar7 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                    Object<(anonymous_namespace)::ObjectStruct>::operator()
                              ((Object<(anonymous_namespace)::ObjectStruct> *)&v,&s1,(Value *)0x0);
            if (EVar7 == Success) {
              bVar5 = std::operator==(&s1.Field1,"default");
              if (!bVar5) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(s3.Field1 == \"default\") failed on line ");
                iVar12 = 0x132;
                goto LAB_00168c9f;
              }
              bVar5 = true;
              if (s1.Field2 != 1) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(s3.Field2 == 1) failed on line ");
                iVar12 = 0x133;
                goto LAB_00168c9f;
              }
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(helper(s3, nullptr) == ErrorCode::Success) failed on line "
                                      );
              iVar12 = 0x131;
LAB_00168c9f:
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
              std::operator<<(poVar8,"\n");
              bVar5 = false;
            }
            std::__cxx11::string::~string((string *)&s1);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(helper(s2, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 300;
LAB_001687f5:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
            std::operator<<(poVar8,"\n");
            bVar5 = false;
          }
          std::__cxx11::string::~string((string *)&s4_1);
          std::__cxx11::string::~string((string *)&i);
          Json::Value::~Value((Value *)&helper);
          cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
          Object<(anonymous_namespace)::ObjectStruct>::~Object
                    ((Object<(anonymous_namespace)::ObjectStruct> *)&v);
          if (!bVar5) {
            return 1;
          }
          Json::Value::Value((Value *)&helper,arrayValue);
          Json::Value::Value(&v,"Hello");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"world!");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"ignore");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s4_1);
          __l._M_len = 1;
          __l._M_array = (iterator)&v;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,__l,(allocator_type *)&s1);
          std::__cxx11::string::~string((string *)&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"Hello",(allocator<char> *)&s1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v.limit_,"world!",(allocator<char> *)&s2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_308 + 8),"ignore",(allocator<char> *)&s3);
          __l_00._M_len = 3;
          __l_00._M_array = (iterator)&v;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&s4_1,__l_00,(allocator_type *)&s4);
          lVar15 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&v.value_ + lVar15));
            lVar15 = lVar15 + -0x20;
          } while (lVar15 != -0x20);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x141;
LAB_00168c51:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
            std::operator<<(poVar8,"\n");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&s4_1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&i);
            this_00 = (InheritedStruct *)&helper;
            goto LAB_0016688e;
          }
          bVar5 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&s4_1);
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(l == expected) failed on line ");
            iVar12 = 0x142;
            goto LAB_00168c51;
          }
          Json::Value::Value(&v,2);
          pVVar9 = Json::Value::operator[]((Value *)&helper,1);
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != InvalidString) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                                    );
            iVar12 = 0x146;
            goto LAB_00168c51;
          }
          Json::Value::Value(&v,"Hello");
          Json::Value::operator=((Value *)&helper,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != InvalidArray) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                                    );
            iVar12 = 0x14a;
            goto LAB_00168c51;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)0x0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, nullptr) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x14d;
            goto LAB_00168c51;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_i != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71(uStack_3cf,uStack_3d0)) {
            poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ")
            ;
            iVar12 = 0x14e;
            goto LAB_00168c51;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
          Json::Value::~Value((Value *)&helper);
          Json::Value::Value((Value *)&helper,arrayValue);
          Json::Value::Value(&v,"Hello");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"world!");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"ignore");
          Json::Value::append((Value *)&helper,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s4_1);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&v;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,__l_01,(allocator_type *)&s1);
          std::__cxx11::string::~string((string *)&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"Hello",(allocator<char> *)&s1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v.limit_,"world!",(allocator<char> *)&s2);
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)&v;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&s4_1,__l_02,(allocator_type *)&s3);
          lVar15 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&v.value_ + lVar15));
            lVar15 = lVar15 + -0x20;
          } while (lVar15 != -0x20);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0x15f;
LAB_001690d7:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            std::operator<<(poVar8,"\n");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&s4_1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&i);
            Json::Value::~Value((Value *)&helper);
            return 1;
          }
          bVar5 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&s4_1);
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(l == expected) failed on line ");
            iVar13 = 0x160;
            goto LAB_001690d7;
          }
          Json::Value::Value(&v,2);
          iVar13 = 1;
          pVVar9 = Json::Value::operator[]((Value *)&helper,1);
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != InvalidString) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                                    );
            iVar13 = 0x164;
            goto LAB_001690d7;
          }
          Json::Value::Value(&v,"Hello");
          Json::Value::operator=((Value *)&helper,&v);
          Json::Value::~Value(&v);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)&helper);
          if (EVar7 != InvalidArray) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                                    );
            iVar13 = 0x168;
            goto LAB_001690d7;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&v,"default",(allocator<char> *)&s1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&v,
                     &v.limit_);
          std::__cxx11::string::~string((string *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,(Value *)0x0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr) == ErrorCode::Success) failed on line "
                                    );
            iVar13 = 0x16b;
            goto LAB_001690d7;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_i != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71(uStack_3cf,uStack_3d0)) {
            poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ")
            ;
            iVar13 = 0x16c;
            goto LAB_001690d7;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
          Json::Value::~Value((Value *)&helper);
          Json::Value::Value((Value *)&s4_1,objectValue);
          Json::Value::Value(&v,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)&s4_1,"field1");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"world!");
          pVVar9 = Json::Value::operator[]((Value *)&s4_1,"field2");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          Json::Value::Value(&v,"ignore");
          pVVar9 = Json::Value::operator[]((Value *)&s4_1,"ignore");
          Json::Value::operator=(pVVar9,&v);
          Json::Value::~Value(&v);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          __l_03._M_len = 1;
          __l_03._M_array = (iterator)&v;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&helper,__l_03,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&i,(allocator_type *)&s1);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&v);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(char (*) [7])"field1",(char (*) [6])"Hello");
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_308 + 8),(char (*) [7])"field2",(char (*) [7])"world!");
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
                    (&local_2c0,(char (*) [7])"ignore",(char (*) [7])"ignore");
          __l_04._M_len = 3;
          __l_04._M_array = (iterator)&v;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&i,__l_04,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&s1,(allocator_type *)&s2);
          lVar15 = 0x80;
          do {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&v.value_ + lVar15));
            lVar15 = lVar15 + -0x40;
          } while (lVar15 != -0x40);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&helper,(Value *)&s4_1);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapHelper(m, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x17c;
LAB_00169494:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
            std::operator<<(poVar8,"\n");
LAB_00169828:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&i);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&helper);
            this_00 = &s4_1;
            goto LAB_0016688e;
          }
          bVar5 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&helper,
                                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&i);
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(m == expected) failed on line ");
            iVar12 = 0x17d;
            goto LAB_00169494;
          }
          Json::Value::Value(&v,arrayValue);
          Json::Value::operator=((Value *)&s4_1,&v);
          Json::Value::~Value(&v);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&helper,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_308 + 8));
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&helper,(Value *)&s4_1);
          if (EVar7 != InvalidObject) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapHelper(m, &v) == ErrorCode::InvalidObject) failed on line "
                                    );
            iVar12 = 0x181;
            goto LAB_00169494;
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&helper,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_308 + 8));
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&v);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&helper,(Value *)0x0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapHelper(m, nullptr) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x184;
            goto LAB_00169494;
          }
          if (&stack0x00000000 != (undefined1 *)0x350) {
            poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(m.empty()) failed on line ")
            ;
            iVar12 = 0x185;
            goto LAB_00169494;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&i);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0xffffffffffffffc8);
          Json::Value::~Value((Value *)0xd0);
          Json::Value::Value((Value *)0xd0,objectValue);
          Json::Value::Value((Value *)&DAT_00000010,"Hello");
          pVVar9 = Json::Value::operator[]((Value *)0xd0,"field1");
          Json::Value::operator=(pVVar9,(Value *)&DAT_00000010);
          Json::Value::~Value((Value *)&DAT_00000010);
          Json::Value::Value((Value *)&DAT_00000010,"world!");
          pVVar9 = Json::Value::operator[]((Value *)0xd0,"field2");
          Json::Value::operator=(pVVar9,(Value *)&DAT_00000010);
          Json::Value::~Value((Value *)&DAT_00000010);
          Json::Value::Value((Value *)&DAT_00000010,"ignore");
          pVVar9 = Json::Value::operator[]((Value *)0xd0,"ignore");
          Json::Value::operator=(pVVar9,(Value *)&DAT_00000010);
          Json::Value::~Value((Value *)&DAT_00000010);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          __l_05._M_len = 1;
          __l_05._M_array = (iterator)&DAT_00000010;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0xffffffffffffffc8,__l_05,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&i,(allocator_type *)0x118);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&DAT_00000010);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,(char (*) [7])"field1",(char (*) [6])"Hello");
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x50,(char (*) [7])"field2",(char (*) [7])"world!");
          __l_06._M_len = 2;
          __l_06._M_array = (iterator)&DAT_00000010;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&i,__l_06,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x118,(allocator_type *)0x1b0);
          lVar15 = 0x40;
          do {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(lVar15 + 0x10));
            lVar15 = lVar15 + -0x40;
          } while (lVar15 != -0x40);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)0xffffffffffffffc8,(Value *)0xd0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x194;
LAB_00169811:
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
            std::operator<<(poVar8,"\n");
            goto LAB_00169828;
          }
          bVar5 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)0xffffffffffffffc8,
                                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&i);
          if (!bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(m == expected) failed on line ");
            iVar12 = 0x195;
            goto LAB_00169811;
          }
          Json::Value::Value((Value *)&DAT_00000010,arrayValue);
          Json::Value::operator=((Value *)0xd0,(Value *)&DAT_00000010);
          Json::Value::~Value((Value *)&DAT_00000010);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)0xffffffffffffffc8,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x50);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&DAT_00000010);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)0xffffffffffffffc8,(Value *)0xd0);
          if (EVar7 != InvalidObject) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::InvalidObject) failed on line "
                                    );
            iVar12 = 0x199;
            goto LAB_00169811;
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,(char (*) [4])0x6a5aaa,(char (*) [8])0x6a0acf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)0xffffffffffffffc8,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&DAT_00000010,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x50);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&DAT_00000010);
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)0xffffffffffffffc8,(Value *)0x0);
          if (EVar7 != Success) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringMapFilterHelper(m, nullptr) == ErrorCode::Success) failed on line "
                                    );
            iVar12 = 0x19c;
            goto LAB_00169811;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&i);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0xffffffffffffffc8);
          Json::Value::~Value((Value *)0xd0);
          Json::Value::Value((Value *)&DAT_00000010,"Hello");
          std::_Optional_payload_base<std::__cxx11::string>::
          _Optional_payload_base<char_const(&)[8]>
                    ((_Optional_payload_base<std::__cxx11::string> *)0xffffffffffffffc8,"default");
          EVar7 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*)>
                                *)0xffffffffffffffc8,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&DAT_00000010,__args_1_06);
          if (EVar7 == Success) {
            _Var6 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)0xffffffffffffffc8,(char (*) [6])"Hello");
            if (!_Var6) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(str == \"Hello\") failed on line ");
              iVar12 = 0x1a8;
              goto LAB_00169947;
            }
            std::optional<std::__cxx11::string>::emplace<char_const(&)[8]>
                      ((optional<std::__cxx11::string> *)0xffffffffffffffc8,(char (*) [8])0x6a0acf);
            EVar7 = std::
                    function<(anonymous_namespace)::ErrorCode_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*)>
                    ::operator()((function<(anonymous_namespace)::ErrorCode_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_Json::Value_*)>
                                  *)0xffffffffffffffc8,
                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x0,__args_1_07);
            if (EVar7 != Success) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(OptionalStringHelper(str, nullptr) == ErrorCode::Success) failed on line "
                                      );
              iVar12 = 0x1ab;
              goto LAB_00169947;
            }
            if ((undefined1)helper.Fail == InvalidInt) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(str == cm::nullopt) failed on line ");
              iVar12 = 0x1ac;
              goto LAB_00169947;
            }
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0xffffffffffffffc8);
            Json::Value::~Value((Value *)&DAT_00000010);
            Json::Value::Value((Value *)&DAT_00000010,"Hello");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"default",(allocator<char> *)0xffffffffffffffc8);
            s4_1.super_ObjectStruct.Field1._M_dataplus._M_p._0_4_ = 1;
            EVar7 = std::
                    function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                    ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                  *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i,(Value *)&DAT_00000010);
            if (EVar7 == Success) {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&i,"Hello");
              if (!bVar5) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(str == \"Hello\") failed on line ");
                iVar13 = 0x1b8;
                goto LAB_00169bc6;
              }
              EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::
                      operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                  *)(anonymous_namespace)::RequiredIntHelper,(int *)0xd0,
                                 (Value *)&DAT_00000010);
              if (EVar7 != InvalidInt) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                                        );
                iVar13 = 0x1b9;
                goto LAB_00169bc6;
              }
              Json::Value::Value((Value *)0xffffffffffffffc8,2);
              Json::Value::operator=((Value *)&DAT_00000010,(Value *)0xffffffffffffffc8);
              Json::Value::~Value((Value *)0xffffffffffffffc8);
              std::__cxx11::string::assign((char *)&i);
              s4_1.super_ObjectStruct.Field1._M_dataplus._M_p._0_4_ = 1;
              EVar7 = std::
                      function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                    *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&i,(Value *)&DAT_00000010);
              if (EVar7 != InvalidString) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::InvalidString) failed on line "
                                        );
                iVar13 = 0x1be;
                goto LAB_00169bc6;
              }
              EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::
                      operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                  *)(anonymous_namespace)::RequiredIntHelper,(int *)0xd0,
                                 (Value *)&DAT_00000010);
              if (EVar7 != Success) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::Success) failed on line "
                                        );
                iVar13 = 0x1bf;
                goto LAB_00169bc6;
              }
              if ((int)s4_1.super_ObjectStruct.Field1._M_dataplus._M_p != 2) {
                poVar8 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line "
                                        );
                iVar13 = 0x1c0;
                goto LAB_00169bc6;
              }
              std::__cxx11::string::assign((char *)&i);
              s4_1.super_ObjectStruct.Field1._M_dataplus._M_p._0_4_ = 1;
              EVar7 = std::
                      function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                    *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&i,(Value *)0x0);
              if (EVar7 != MissingRequired) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredStringHelper(str, nullptr) == ErrorCode::MissingRequired) failed on line "
                                        );
                iVar13 = 0x1c5;
                goto LAB_00169bc6;
              }
              iVar13 = 0;
              EVar7 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::
                      operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                  *)(anonymous_namespace)::RequiredIntHelper,(int *)0xd0,
                                 (Value *)0x0);
              if (EVar7 != MissingRequired) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredIntHelper(i, nullptr) == ErrorCode::MissingRequired) failed on line "
                                        );
                iVar13 = 0x1c6;
                goto LAB_00169bc6;
              }
            }
            else {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::Success) failed on line "
                                      );
              iVar13 = 0x1b7;
LAB_00169bc6:
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
              std::operator<<(poVar8,"\n");
              iVar13 = 1;
            }
            goto LAB_00166ce9;
          }
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(OptionalStringHelper(str, &v) == ErrorCode::Success) failed on line "
                                  );
          iVar12 = 0x1a7;
LAB_00169947:
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
          std::operator<<(poVar8,"\n");
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0xffffffffffffffc8);
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(StringHelper(str, &v) == ErrorCode::Success) failed on line "
                                  );
          iVar12 = 0x89;
LAB_00166cd2:
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
          std::operator<<(poVar8,"\n");
LAB_00166ce9:
          std::__cxx11::string::~string((string *)&i);
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::Success) failed on line "
                                );
        iVar12 = 0x72;
LAB_00166aaa:
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
        std::operator<<(poVar8,"\n");
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::Success) failed on line "
                              );
      iVar12 = 0x60;
LAB_001669ad:
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
      std::operator<<(poVar8,"\n");
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(IntHelper(i, &v) == ErrorCode::Success) failed on line ");
    iVar12 = 0x4e;
LAB_0016686e:
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
    std::operator<<(poVar8,"\n");
  }
  this_00 = (InheritedStruct *)&v;
LAB_0016688e:
  Json::Value::~Value((Value *)this_00);
  return iVar13;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/ [])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}